

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utOpenGEXImportExport.cpp
# Opt level: O2

void __thiscall
utOpenGEXImportExport_importLWSFromFileTest_Test::TestBody
          (utOpenGEXImportExport_importLWSFromFileTest_Test *this)

{
  int iVar1;
  char *in_R9;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  AssertionResult gtest_ar_;
  
  iVar1 = (*(this->super_utOpenGEXImportExport).super_AbstractImportExportBase.super_Test._vptr_Test
            [6])();
  gtest_ar_.success_ = SUB41(iVar1,0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"importerTest()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utOpenGEXImportExport.cpp"
               ,0x3e,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F( utOpenGEXImportExport, importLWSFromFileTest ) {
    EXPECT_TRUE( importerTest() );
}